

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O1

TGAColor __thiscall TGAImage::get(TGAImage *this,size_t x,size_t y)

{
  uint uVar1;
  pointer puVar2;
  undefined8 in_RAX;
  uint local_8;
  uint local_4;
  
  puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == puVar2) || (this->width <= x)) || (this->height <= y))
  {
    local_8 = 0;
    local_4 = 0;
  }
  else {
    uVar1 = this->bytespp;
    local_4._1_3_ = (undefined3)((ulong)in_RAX >> 0x28);
    local_4 = CONCAT31(local_4._1_3_,(char)uVar1);
    local_8 = 0;
    if ((char)uVar1 != '\0') {
      memcpy(&local_8,puVar2 + (this->width * y + x) * (ulong)uVar1,(ulong)(uVar1 & 0xff));
    }
  }
  return (TGAColor)((uint5)local_4 << 0x20 | (uint5)local_8);
}

Assistant:

TGAColor TGAImage::get(const size_t x, const size_t y) const
{
    if (!data.size() || x < 0 || y < 0 || x >= width || y >= height) return {};
    return TGAColor(data.data() + (x + y * width) * bytespp, bytespp);
}